

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O1

void __thiscall
CTxMemPool::TrimToSize
          (CTxMemPool *this,size_t sizelimit,
          vector<COutPoint,_std::allocator<COutPoint>_> *pvNoSpendsRemaining)

{
  pointer *ppCVar1;
  long lVar2;
  size_type sVar3;
  pointer poVar4;
  pointer pCVar5;
  iterator __position;
  double dVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pCVar10;
  pointer pCVar11;
  bool bVar12;
  size_t sVar13;
  _Rb_tree_node_base *p_Var14;
  Logger *this_00;
  CTxMemPool *this_01;
  _Rb_tree_header *p_Var15;
  CTransaction *tx;
  CTxIn *txin;
  txiter entryit;
  pointer __args;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  vector<CTransaction,_std::allocator<CTransaction>_> txn;
  CFeeRate removed;
  CFeeRate maxFeeRateRemoved;
  uint nTxnRemoved;
  GenTxid local_8c;
  setEntries stage;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  nTxnRemoved = 0;
  maxFeeRateRemoved.nSatoshisPerK = 0;
  sVar3 = (this->mapTx).node_count;
  while (sVar3 != 0) {
    p_Var15 = &stage._M_t._M_impl.super__Rb_tree_header;
    sVar13 = DynamicMemoryUsage(this);
    if (sVar13 <= sizelimit) break;
    poVar4 = (((this->mapTx).
               super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
              .member)->
             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.left_;
    entryit.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                    *)&poVar4[-0xe].
                       super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                       .super_type.right_;
    if (poVar4 == (pointer)0x0) {
      entryit.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                      *)0x0;
    }
    stage._M_t._M_impl._0_8_ =
         *(undefined8 *)
          ((long)&((entryit.node)->
                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                  ).
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                  .
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                  .
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                  .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                  super_pod_value_holder<CTxMemPoolEntry>.space + 0xd8);
    this_01 = (CTxMemPool *)&removed;
    CFeeRate::CFeeRate((CFeeRate *)this_01,(CAmount *)&stage,
                       *(uint32_t *)
                        ((long)&((entryit.node)->
                                super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                .
                                super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                .super_pod_value_holder<CTxMemPoolEntry>.space + 0xd0));
    removed.nSatoshisPerK =
         removed.nSatoshisPerK + (this->m_opts).incremental_relay_feerate.nSatoshisPerK;
    dVar6 = (double)removed.nSatoshisPerK;
    if (this->rollingMinimumFeeRate <= dVar6 && dVar6 != this->rollingMinimumFeeRate) {
      this->rollingMinimumFeeRate = dVar6;
      this->blockSinceLastRollingFeeBump = false;
    }
    if (maxFeeRateRemoved.nSatoshisPerK < removed.nSatoshisPerK) {
      maxFeeRateRemoved.nSatoshisPerK = removed.nSatoshisPerK;
    }
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    stage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var15->_M_header;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var15->_M_header;
    CalculateDescendants(this_01,entryit,&stage);
    nTxnRemoved = nTxnRemoved + (int)stage._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pvNoSpendsRemaining != (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0) {
      std::vector<CTransaction,_std::allocator<CTransaction>_>::reserve
                (&txn,stage._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (p_Var14 = stage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var14 != p_Var15;
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
        std::vector<CTransaction,_std::allocator<CTransaction>_>::push_back
                  (&txn,(value_type *)**(undefined8 **)(p_Var14 + 1));
      }
    }
    RemoveStaged(this,&stage,false,SIZELIMIT);
    pCVar11 = txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pCVar10 = txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pvNoSpendsRemaining != (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0) {
      for (; pCVar10 != pCVar11; pCVar10 = pCVar10 + 1) {
        pCVar5 = (pCVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__args = (pCVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start; __args != pCVar5; __args = __args + 1) {
          uVar7 = *(undefined8 *)
                   (__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
          local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
               *(undefined8 *)
                ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
               *(undefined8 *)
                ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
               *(undefined8 *)
                ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._0_3_ = SUB83(uVar7,0);
          local_8c._0_4_ =
               (uint)(uint3)local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._0_3_ << 8;
          local_8c.m_hash.super_base_blob<256U>.m_data._M_elems._3_5_ =
               SUB85((ulong)uVar7 >> 0x18,0);
          bVar12 = exists(this,&local_8c);
          if (!bVar12) {
            __position._M_current =
                 (pvNoSpendsRemaining->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pvNoSpendsRemaining->super__Vector_base<COutPoint,_std::allocator<COutPoint>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<COutPoint,std::allocator<COutPoint>>::_M_realloc_insert<COutPoint_const&>
                        ((vector<COutPoint,std::allocator<COutPoint>> *)pvNoSpendsRemaining,
                         __position,&__args->prevout);
            }
            else {
              (__position._M_current)->n = (__args->prevout).n;
              uVar7 = *(undefined8 *)
                       (__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar8 = *(undefined8 *)
                       ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar9 = *(undefined8 *)
                       ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                       0x18);
              *(undefined8 *)
               (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
               0x10) = *(undefined8 *)
                        ((__args->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems +
                        0x10);
              *(undefined8 *)
               (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
               0x18) = uVar9;
              *(undefined8 *)
               ((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems =
                   uVar7;
              *(undefined8 *)
               (((__position._M_current)->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
                   = uVar8;
              ppCVar1 = &(pvNoSpendsRemaining->
                         super__Vector_base<COutPoint,_std::allocator<COutPoint>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppCVar1 = *ppCVar1 + 1;
            }
          }
        }
      }
    }
    std::vector<CTransaction,_std::allocator<CTransaction>_>::~vector(&txn);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&stage._M_t);
    sVar3 = (this->mapTx).node_count;
  }
  if (0 < maxFeeRateRemoved.nSatoshisPerK) {
    this_00 = LogInstance();
    bVar12 = BCLog::Logger::WillLogCategoryLevel(this_00,MEMPOOL,Debug);
    if (bVar12) {
      local_8c.m_is_wtxid = true;
      local_8c.m_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      local_8c.m_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      local_8c.m_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      CFeeRate::ToString_abi_cxx11_
                ((string *)&stage,&maxFeeRateRemoved,(FeeEstimateMode *)&local_8c);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
      ;
      source_file._M_len = 0x5d;
      logging_function._M_str = "TrimToSize";
      logging_function._M_len = 10;
      LogPrintFormatInternal<unsigned_int,std::__cxx11::string>
                (logging_function,source_file,0x48f,MEMPOOL,Debug,
                 (ConstevalFormatString<2U>)0xfd2506,&nTxnRemoved,(string *)&stage);
      if ((_Base_ptr *)stage._M_t._M_impl._0_8_ !=
          &stage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)stage._M_t._M_impl._0_8_,
                        (ulong)((long)&(stage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
                                       )->_M_color + 1));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::TrimToSize(size_t sizelimit, std::vector<COutPoint>* pvNoSpendsRemaining) {
    AssertLockHeld(cs);

    unsigned nTxnRemoved = 0;
    CFeeRate maxFeeRateRemoved(0);
    while (!mapTx.empty() && DynamicMemoryUsage() > sizelimit) {
        indexed_transaction_set::index<descendant_score>::type::iterator it = mapTx.get<descendant_score>().begin();

        // We set the new mempool min fee to the feerate of the removed set, plus the
        // "minimum reasonable fee rate" (ie some value under which we consider txn
        // to have 0 fee). This way, we don't allow txn to enter mempool with feerate
        // equal to txn which were removed with no block in between.
        CFeeRate removed(it->GetModFeesWithDescendants(), it->GetSizeWithDescendants());
        removed += m_opts.incremental_relay_feerate;
        trackPackageRemoved(removed);
        maxFeeRateRemoved = std::max(maxFeeRateRemoved, removed);

        setEntries stage;
        CalculateDescendants(mapTx.project<0>(it), stage);
        nTxnRemoved += stage.size();

        std::vector<CTransaction> txn;
        if (pvNoSpendsRemaining) {
            txn.reserve(stage.size());
            for (txiter iter : stage)
                txn.push_back(iter->GetTx());
        }
        RemoveStaged(stage, false, MemPoolRemovalReason::SIZELIMIT);
        if (pvNoSpendsRemaining) {
            for (const CTransaction& tx : txn) {
                for (const CTxIn& txin : tx.vin) {
                    if (exists(GenTxid::Txid(txin.prevout.hash))) continue;
                    pvNoSpendsRemaining->push_back(txin.prevout);
                }
            }
        }
    }

    if (maxFeeRateRemoved > CFeeRate(0)) {
        LogDebug(BCLog::MEMPOOL, "Removed %u txn, rolling minimum fee bumped to %s\n", nTxnRemoved, maxFeeRateRemoved.ToString());
    }
}